

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O1

cl_int clMemFreeINTEL_EMU(cl_context context,void *ptr)

{
  mutex *__mutex;
  CLIntercept *pCVar1;
  int iVar2;
  mapped_type *this;
  _Rb_tree_header *p_Var3;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_> __dest
  ;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pointer ppvVar7;
  cl_int cVar8;
  pointer __src;
  pointer *pppvVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::_Rb_tree_iterator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
  pVar10;
  key_type pvStack_38;
  cl_context p_Stack_30;
  
  pCVar1 = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Config).Emulate_cl_intel_unified_shared_memory != true)) {
    return -0x3b;
  }
  __mutex = &g_pIntercept->m_Mutex;
  pvStack_38 = ptr;
  p_Stack_30 = context;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar4 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar4);
  }
  this = std::
         map<_cl_context_*,_CLIntercept::SUSMContextInfo,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SUSMContextInfo>_>_>
         ::operator[](&pCVar1->m_USMContextInfoMap,&p_Stack_30);
  p_Var3 = &(this->AllocMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->AllocMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var3->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < pvStack_38])
  {
    if (*(void **)(p_Var6 + 1) >= pvStack_38) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var3) &&
     (p_Var6 = p_Var5, pvStack_38 < *(void **)(p_Var5 + 1))) {
    p_Var6 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var3) {
    cVar8 = -0x26;
    goto LAB_0018b33b;
  }
  iVar2 = *(int *)&p_Var6[1]._M_parent;
  if (iVar2 == 0x4197) {
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                       ((this->HostAllocVector).
                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (this->HostAllocVector).
                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                        super__Vector_impl_data._M_finish,&pvStack_38);
    pppvVar9 = &(this->HostAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    __src = __dest._M_current + 1;
    ppvVar7 = (this->HostAllocVector).
              super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_0018b2f6:
    if (__src != ppvVar7) {
      memmove(__dest._M_current,__src,(long)ppvVar7 - (long)__src);
    }
    *pppvVar9 = *pppvVar9 + -1;
  }
  else {
    if (iVar2 == 0x4198) {
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                         ((this->DeviceAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->DeviceAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,&pvStack_38);
      pppvVar9 = &(this->DeviceAllocVector).
                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __src = __dest._M_current + 1;
      ppvVar7 = (this->DeviceAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      goto LAB_0018b2f6;
    }
    if (iVar2 == 0x4199) {
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<void_const**,std::vector<void_const*,std::allocator<void_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<void_const*const>>
                         ((this->SharedAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (this->SharedAllocVector).
                          super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,&pvStack_38);
      pppvVar9 = &(this->SharedAllocVector).
                  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      __src = __dest._M_current + 1;
      ppvVar7 = (this->SharedAllocVector).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      goto LAB_0018b2f6;
    }
  }
  pVar10 = std::
           _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
           ::equal_range((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
                          *)this,&pvStack_38);
  std::
  _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
  ::_M_erase_aux((_Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SUSMAllocInfo>_>_>
                  *)this,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node);
  (*(pCVar1->m_Dispatch).clSVMFree)(p_Stack_30,pvStack_38);
  pvStack_38 = (void *)0x0;
  cVar8 = 0;
LAB_0018b33b:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return cVar8;
}

Assistant:

cl_int CL_API_CALL clMemFreeINTEL_EMU(
    cl_context context,
    void* ptr)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedMemFree(
            context,
            ptr );
    }

    return CL_INVALID_OPERATION;
}